

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O0

uint8_t * __thiscall
google::protobuf::io::EpsCopyOutputStream::WriteString
          (EpsCopyOutputStream *this,uint32_t num,Cord *s,uint8_t *ptr)

{
  LogMessage *pLVar1;
  uint8_t *puVar2;
  byte *ptr_00;
  uint8_t *ptr_local;
  Cord *s_local;
  uint32_t num_local;
  EpsCopyOutputStream *this_local;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  LogMessageFatal local_48 [23];
  Voidify local_31;
  byte *local_30;
  undefined4 local_28;
  uint32_t local_24;
  EpsCopyOutputStream *local_20;
  byte *local_18;
  uint local_c;
  
  local_30 = EnsureSpace(this,ptr);
  local_28 = 2;
  local_24 = num;
  local_20 = this;
  if (local_30 < this->end_) {
    local_18 = local_30;
    for (local_c = num << 3 | 2; 0x7f < local_c; local_c = local_c >> 7) {
      *local_18 = (byte)local_c | 0x80;
      local_18 = local_18 + 1;
    }
    ptr_00 = local_18 + 1;
    *local_18 = (byte)local_c;
    local_18 = ptr_00;
    puVar2 = WriteCordOutline(this,s,ptr_00);
    return puVar2;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_58,"ptr < end_");
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_48,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/coded_stream.h"
             ,0x355,local_58._M_len,local_58._M_str);
  pLVar1 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_48);
  absl::lts_20240722::log_internal::Voidify::operator&&(&local_31,pLVar1);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_48);
}

Assistant:

uint8_t* WriteString(uint32_t num, const absl::Cord& s, uint8_t* ptr) {
    ptr = EnsureSpace(ptr);
    ptr = WriteTag(num, 2, ptr);
    return WriteCordOutline(s, ptr);
  }